

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O3

void __thiscall QAbstractButton::mouseReleaseEvent(QAbstractButton *this,QMouseEvent *e)

{
  byte bVar1;
  long lVar2;
  QAbstractButtonPrivate *this_00;
  char cVar3;
  QMouseEvent QVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) == 1) {
    this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
    bVar1 = this_00->field_0x28c;
    this_00->field_0x28c = bVar1 & 0xbf;
    if ((bVar1 & 0x10) != 0) {
      QEventPoint::position();
      cVar3 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
      if (cVar3 == '\0') {
        QVar4 = (QMouseEvent)0x0;
        setDown(this,false);
      }
      else {
        QBasicTimer::stop();
        QAbstractButtonPrivate::click(this_00);
        QVar4 = (QMouseEvent)0x1;
      }
      goto LAB_003beaf2;
    }
    if ((bVar1 & 0x20) == 0) {
      QWidget::update(*(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8);
    }
  }
  QVar4 = (QMouseEvent)0x0;
LAB_003beaf2:
  e[0xc] = QVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QAbstractButton);

    if (e->button() != Qt::LeftButton) {
        e->ignore();
        return;
    }

    d->pressed = false;

    if (!d->down) {
        // refresh is required by QMacStyle to resume the default button animation
        d->refresh();
        e->ignore();
        return;
    }

    if (hitButton(e->position().toPoint())) {
        d->repeatTimer.stop();
        d->click();
        e->accept();
    } else {
        setDown(false);
        e->ignore();
    }
}